

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error comma(context *ctx,token *token,opcode *op)

{
  bool bVar1;
  token local_68;
  uint local_40;
  byte local_29;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  local_29 = 0;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  confirm_type((token *)ctx,(token_type)op);
  bVar1 = error::operator_cast_to_bool((error *)ctx);
  if (bVar1) {
    local_29 = 1;
  }
  local_40 = (uint)bVar1;
  if ((local_29 & 1) == 0) {
    error::~error((error *)ctx);
  }
  if (local_40 == 0) {
    context::tokenize(&local_68,(context *)token_local);
    memcpy(op_local,&local_68,0x24);
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(comma)
{
    CHECK(confirm_type(token, token_type::comma));
    token = ctx.tokenize();
    return {};
}